

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::GetNode
          (TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *this,int key)

{
  TValueTraits<FString> local_29;
  TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *pTStack_28;
  TValueTraits<FString> traits;
  Node *n;
  int key_local;
  TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *this_local;
  
  pTStack_28 = (TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *)FindKey(this,key);
  this_local = pTStack_28;
  if (pTStack_28 == (TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *)0x0) {
    pTStack_28 = (TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *)NewKey(this,key);
    TValueTraits<FString>::Init(&local_29,(FString *)&pTStack_28->Size);
    this_local = pTStack_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}